

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O3

bool TimeFunctionParallel(TimeResults *results,function<bool_()> *func)

{
  _Manager_type p_Var1;
  pointer ptVar2;
  char cVar3;
  ThreadResult *pair;
  long *__s;
  ulong uVar4;
  thread *ptVar5;
  long *plVar6;
  anon_class_40_5_9d02135f_for__M_head_impl *extraout_RDX;
  anon_class_40_5_9d02135f_for__M_head_impl *extraout_RDX_00;
  anon_class_40_5_9d02135f_for__M_head_impl *extraout_RDX_01;
  anon_class_40_5_9d02135f_for__M_head_impl *extraout_RDX_02;
  anon_class_40_5_9d02135f_for__M_head_impl *extraout_RDX_03;
  anon_class_40_5_9d02135f_for__M_head_impl *__args;
  thread *thread;
  allocator_type *paVar7;
  allocator_type *__a;
  ulong uVar8;
  thread *ptVar9;
  ulong __n;
  int iVar10;
  long lVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  uint32_t iterations_between_time_checks;
  Latch latch;
  vector<std::thread,_std::allocator<std::thread>_> local_148;
  long *local_128;
  long *local_120;
  long *local_118;
  uint32_t local_10c;
  _Any_data local_108;
  _Manager_type local_f8;
  _Invoker_type local_f0;
  TimeResults *local_e8;
  function<bool_()> *local_e0;
  thread local_d8;
  int *local_d0;
  long **local_c8;
  function<bool_()> *local_c0;
  uint32_t *local_b8;
  _Any_data local_b0;
  code *local_a0;
  int local_90 [2];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined8 local_68;
  condition_variable local_60 [48];
  
  if (g_threads < 2) {
    local_108 = (_Any_data)0x0;
    local_f8 = (_Manager_type)0x0;
    local_f0 = func->_M_invoker;
    p_Var1 = (func->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_108 = (func->super__Function_base)._M_functor;
      *(undefined1 (*) [16])&(func->super__Function_base)._M_manager = (undefined1  [16])0x0;
      local_f8 = p_Var1;
    }
    cVar3 = TimeFunction(results,(function<bool_()> *)&local_108);
    if (local_f8 != (_Manager_type)0x0) {
      (*local_f8)(&local_108,&local_108,__destroy_functor);
    }
  }
  else {
    std::function<bool_()>::function((function<bool_()> *)&local_b0,func);
    local_10c = IterationsBetweenTimeChecks((function<bool_()> *)&local_b0);
    if (local_a0 != (code *)0x0) {
      (*local_a0)(&local_b0,&local_b0,__destroy_functor);
    }
    if (local_10c == 0) {
      cVar3 = '\0';
    }
    else {
      lVar11 = (long)g_threads;
      local_e8 = results;
      if (lVar11 < 0) {
        std::__throw_length_error("cannot create std::vector larger than max_size()");
      }
      local_128 = (long *)0x0;
      if (g_threads == 0) {
        local_128 = (long *)0x0;
        local_90[0] = 0;
        plVar6 = (long *)0x0;
        local_120 = (long *)0x0;
      }
      else {
        __s = (long *)operator_new(lVar11 * 0x18);
        plVar6 = __s + lVar11 * 3;
        local_128 = __s;
        memset(__s,0,lVar11 * 0x18);
        local_120 = __s + lVar11 * 3;
        local_90[0] = g_threads;
      }
      local_88 = (undefined1  [16])0x0;
      local_78 = (undefined1  [16])0x0;
      iVar10 = 0;
      local_68 = 0;
      local_118 = plVar6;
      std::condition_variable::condition_variable(local_60);
      local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (0 < g_threads) {
        __a = (allocator_type *)0x0;
        __args = extraout_RDX;
        local_e0 = func;
        do {
          local_d0 = local_90;
          local_c8 = &local_128;
          local_c0 = local_e0;
          local_b8 = &local_10c;
          local_d8._M_id._M_thread._0_4_ = iVar10;
          if (__a == (allocator_type *)
                     local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage) {
            ptVar2 = local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                     .super__Vector_impl_data._M_start;
            if ((long)__a -
                (long)local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar8 = (long)__a -
                    (long)local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3;
            uVar4 = uVar8 + (uVar8 == 0);
            __n = uVar4 + uVar8;
            if (0xffffffffffffffe < __n) {
              __n = 0xfffffffffffffff;
            }
            if (CARRY8(uVar4,uVar8)) {
              __n = 0xfffffffffffffff;
            }
            if (__n == 0) {
              ptVar5 = (thread *)0x0;
            }
            else {
              ptVar5 = __gnu_cxx::new_allocator<std::thread>::allocate
                                 ((new_allocator<std::thread> *)&local_148,__n,(void *)0x0);
              __args = extraout_RDX_01;
            }
            std::allocator_traits<std::allocator<std::thread>>::
            construct<std::thread,TimeFunctionParallel(TimeResults*,std::function<bool()>)::__0>
                      ((allocator_type *)(ptVar5 + uVar8),&local_d8,__args);
            ptVar9 = ptVar5;
            for (paVar7 = (allocator_type *)ptVar2; paVar7 != __a; paVar7 = paVar7 + 8) {
              (ptVar9->_M_id)._M_thread = *(native_handle_type *)paVar7;
              *(native_handle_type *)paVar7 = 0;
              ptVar9 = ptVar9 + 1;
            }
            __args = extraout_RDX_02;
            if ((allocator_type *)ptVar2 != (allocator_type *)0x0) {
              operator_delete(ptVar2,(long)local_148.
                                           super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)ptVar2);
              __args = extraout_RDX_03;
            }
            __a = (allocator_type *)(ptVar9 + 1);
            local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)__a;
            local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start = ptVar5;
            local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = ptVar5 + __n;
          }
          else {
            std::allocator_traits<std::allocator<std::thread>>::
            construct<std::thread,TimeFunctionParallel(TimeResults*,std::function<bool()>)::__0>
                      (__a,&local_d8,__args);
            __a = (allocator_type *)
                  (local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1);
            local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)__a;
            __args = extraout_RDX_00;
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < g_threads);
        for (paVar7 = (allocator_type *)
                      local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start; paVar7 != __a; paVar7 = paVar7 + 8)
        {
          std::thread::join();
        }
      }
      uVar12 = 0;
      uVar13 = 0;
      local_e8->num_calls = 0;
      local_e8->us = 0;
      plVar6 = local_128;
      if (local_128 == local_120) {
        cVar3 = '\x01';
      }
      else {
        do {
          cVar3 = (char)plVar6[2];
          if (cVar3 != '\x01') break;
          uVar12 = uVar12 + *plVar6;
          uVar13 = uVar13 + plVar6[1];
          local_e8->num_calls = uVar12;
          local_e8->us = uVar13;
          plVar6 = plVar6 + 3;
        } while (plVar6 != local_120);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_148);
      std::condition_variable::~condition_variable(local_60);
      if (local_128 != (long *)0x0) {
        operator_delete(local_128,(long)local_118 - (long)local_128);
      }
    }
  }
  return (bool)cVar3;
}

Assistant:

static bool TimeFunctionParallel(TimeResults *results,
                                 std::function<bool()> func) {
  if (g_threads <= 1) {
    return TimeFunction(results, std::move(func));
  }

  uint32_t iterations_between_time_checks = IterationsBetweenTimeChecks(func);
  if (iterations_between_time_checks == 0) {
    return false;
  }

  struct ThreadResult {
    TimeResults time_result;
    bool ok = false;
  };
  std::vector<ThreadResult> thread_results(g_threads);
  Latch latch(g_threads);
  std::vector<std::thread> threads;
  for (int i = 0; i < g_threads; i++) {
    threads.emplace_back([&, i] {
      // Wait for all the threads to be ready before running the benchmark.
      latch.ArriveAndWait();
      thread_results[i].ok = TimeFunctionImpl(
          &thread_results[i].time_result, func, iterations_between_time_checks);
    });
  }

  for (auto &thread : threads) {
    thread.join();
  }

  results->num_calls = 0;
  results->us = 0;
  for (const auto &pair : thread_results) {
    if (!pair.ok) {
      return false;
    }
    results->num_calls += pair.time_result.num_calls;
    results->us += pair.time_result.us;
  }
  return true;
}